

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  int *piVar1;
  ImDrawChannel *pIVar2;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  ImGuiContext *pIVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ImDrawCmd *pIVar9;
  unsigned_short *puVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  
  if (this->_ChannelsCount < 2) {
    return;
  }
  iVar16 = 0;
  ChannelsSetCurrent(this,0);
  uVar8 = (this->CmdBuffer).Size;
  uVar11 = 0;
  if ((ulong)uVar8 != 0) {
    if ((int)uVar8 < 1) {
LAB_0014b0ca:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x35d,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    uVar11 = uVar8;
    if ((this->CmdBuffer).Data[(ulong)uVar8 - 1].ElemCount == 0) {
      (this->CmdBuffer).Size = uVar8 - 1;
      uVar11 = uVar8 - 1;
    }
  }
  iVar13 = this->_ChannelsCount;
  iVar6 = 0;
  if (1 < (long)iVar13) {
    uVar8 = (this->_Channels).Size;
    pIVar2 = (this->_Channels).Data;
    uVar5 = 1;
    if (1 < (int)uVar8) {
      uVar5 = (ulong)uVar8;
    }
    iVar6 = 0;
    lVar7 = 0x20;
    iVar16 = 0;
    do {
      if (uVar5 * 0x20 == lVar7) goto LAB_0014b0ab;
      uVar8 = *(uint *)((long)&(pIVar2->CmdBuffer).Size + lVar7);
      if ((ulong)uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        if ((int)uVar8 < 1) goto LAB_0014b0ca;
        if (*(int *)(*(long *)((long)&(pIVar2->CmdBuffer).Data + lVar7) + -0x30 +
                    (ulong)uVar8 * 0x30) == 0) {
          uVar8 = uVar8 - 1;
          *(uint *)((long)&(pIVar2->CmdBuffer).Size + lVar7) = uVar8;
        }
      }
      iVar6 = iVar6 + uVar8;
      iVar16 = iVar16 + *(int *)((long)&(pIVar2->IdxBuffer).Size + lVar7);
      lVar7 = lVar7 + 0x20;
    } while ((long)iVar13 * 0x20 != lVar7);
    uVar11 = (this->CmdBuffer).Size;
  }
  pIVar3 = GImGui;
  iVar12 = uVar11 + iVar6;
  iVar13 = (this->CmdBuffer).Capacity;
  if (iVar13 < iVar12) {
    if (iVar13 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = iVar13 / 2 + iVar13;
    }
    if (iVar13 <= iVar12) {
      iVar13 = iVar12;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (ImDrawCmd *)(*(pIVar3->IO).MemAllocFn)((long)iVar13 * 0x30);
    pIVar9 = (this->CmdBuffer).Data;
    if (pIVar9 == (ImDrawCmd *)0x0) {
LAB_0014af17:
      pIVar9 = (ImDrawCmd *)0x0;
      pIVar3 = GImGui;
    }
    else {
      memcpy(__dest,pIVar9,(long)(this->CmdBuffer).Size * 0x30);
      pIVar3 = GImGui;
      pIVar9 = (this->CmdBuffer).Data;
      if (pIVar9 == (ImDrawCmd *)0x0) goto LAB_0014af17;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar3->IO).MemFreeFn)(pIVar9);
    (this->CmdBuffer).Data = __dest;
    (this->CmdBuffer).Capacity = iVar13;
  }
  (this->CmdBuffer).Size = iVar12;
  pIVar3 = GImGui;
  lVar7 = (long)(this->IdxBuffer).Size + (long)iVar16;
  iVar13 = (this->IdxBuffer).Capacity;
  iVar14 = (int)lVar7;
  if (iVar14 <= iVar13) {
    __dest_00 = (this->IdxBuffer).Data;
    goto LAB_0014afcb;
  }
  if (iVar13 == 0) {
    iVar13 = 8;
  }
  else {
    iVar13 = iVar13 / 2 + iVar13;
  }
  if (iVar13 <= iVar14) {
    iVar13 = iVar14;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest_00 = (unsigned_short *)(*(pIVar3->IO).MemAllocFn)((long)iVar13 * 2);
  puVar10 = (this->IdxBuffer).Data;
  if (puVar10 == (unsigned_short *)0x0) {
LAB_0014afb8:
    puVar10 = (unsigned_short *)0x0;
    pIVar3 = GImGui;
  }
  else {
    memcpy(__dest_00,puVar10,(long)(this->IdxBuffer).Size * 2);
    pIVar3 = GImGui;
    puVar10 = (this->IdxBuffer).Data;
    if (puVar10 == (unsigned_short *)0x0) goto LAB_0014afb8;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar3->IO).MemFreeFn)(puVar10);
  (this->IdxBuffer).Data = __dest_00;
  (this->IdxBuffer).Capacity = iVar13;
  iVar12 = (this->CmdBuffer).Size;
LAB_0014afcb:
  (this->IdxBuffer).Size = iVar14;
  pIVar9 = (this->CmdBuffer).Data;
  this->_IdxWritePtr = __dest_00 + (lVar7 - iVar16);
  if (1 < this->_ChannelsCount) {
    pIVar9 = pIVar9 + ((long)iVar12 - (long)iVar6);
    lVar7 = 1;
    lVar15 = 0x38;
    do {
      if ((this->_Channels).Size <= lVar7) {
LAB_0014b0ab:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,
                      "value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar2 = (this->_Channels).Data;
      lVar4 = (long)*(int *)((long)pIVar2 + lVar15 + -0x18);
      if (lVar4 != 0) {
        memcpy(pIVar9,*(void **)((long)pIVar2 + lVar15 + -0x10),lVar4 * 0x30);
        pIVar9 = pIVar9 + lVar4;
      }
      lVar4 = (long)*(int *)((long)pIVar2 + lVar15 + -8);
      if (lVar4 != 0) {
        memcpy(this->_IdxWritePtr,*(void **)((long)&(pIVar2->CmdBuffer).Size + lVar15),lVar4 * 2);
        this->_IdxWritePtr = this->_IdxWritePtr + lVar4;
      }
      lVar7 = lVar7 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar7 < this->_ChannelsCount);
  }
  AddDrawCmd(this);
  this->_ChannelsCount = 1;
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    AddDrawCmd();
    _ChannelsCount = 1;
}